

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinylogger.h
# Opt level: O0

int tlog::ConsoleOutput::consoleWidth(void)

{
  undefined1 local_10 [2];
  ushort local_e;
  winsize size;
  
  ioctl(1,0x5413,local_10);
  return (int)local_e;
}

Assistant:

static int consoleWidth() {
#ifdef _WIN32
            CONSOLE_SCREEN_BUFFER_INFO csbi;
            GetConsoleScreenBufferInfo(GetStdHandle(STD_OUTPUT_HANDLE), &csbi);
            return csbi.srWindow.Right - csbi.srWindow.Left + 1;
#else
            winsize size;
            ioctl(STDOUT_FILENO, TIOCGWINSZ, &size);
            return size.ws_col;
#endif
        }